

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

CURLMcode singlesocket(Curl_multi *multi,Curl_easy *data)

{
  Curl_hash *sh;
  curl_socket_t *pcVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  Curl_sh_entry *pCVar6;
  void *pvVar7;
  byte bVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  Curl_easy *data_local;
  int local_54;
  easy_pollset cur_poll;
  
  data_local = data;
  multi_getsock(data,&cur_poll);
  sh = &multi->sockhash;
  uVar12 = 0;
  do {
    if (cur_poll.num <= uVar12) {
      uVar12 = 0;
      do {
        if ((data_local->last_poll).num <= uVar12) {
          *(ulong *)((data_local->last_poll).sockets + 4) =
               CONCAT44(cur_poll.num,cur_poll.sockets[4]);
          (data_local->last_poll).actions[0] = cur_poll.actions[0];
          (data_local->last_poll).actions[1] = cur_poll.actions[1];
          (data_local->last_poll).actions[2] = cur_poll.actions[2];
          (data_local->last_poll).actions[3] = cur_poll.actions[3];
          (data_local->last_poll).actions[4] = cur_poll.actions[4];
          *(undefined3 *)&(data_local->last_poll).field_0x1d = cur_poll._29_3_;
          *(undefined8 *)(data_local->last_poll).sockets = cur_poll.sockets._0_8_;
          *(undefined8 *)((data_local->last_poll).sockets + 2) = cur_poll.sockets._8_8_;
          return CURLM_OK;
        }
        iVar4 = (data_local->last_poll).sockets[uVar12];
        uVar9 = 0;
        do {
          if (cur_poll.num == uVar9) {
            pCVar6 = sh_getentry(sh,iVar4);
            if (pCVar6 != (Curl_sh_entry *)0x0) {
              bVar8 = (data_local->last_poll).actions[uVar12];
              uVar11 = pCVar6->users - 1;
              pCVar6->users = uVar11;
              if ((bVar8 & 2) != 0) {
                pCVar6->writers = pCVar6->writers - 1;
              }
              if ((bVar8 & 1) != 0) {
                pCVar6->readers = pCVar6->readers - 1;
              }
              if (uVar11 == 0) {
                if (multi->socket_cb != (curl_socket_callback)0x0) {
                  multi->field_0x1b1 = multi->field_0x1b1 | 4;
                  iVar5 = (*multi->socket_cb)(data_local,iVar4,4,multi->socket_userp,pCVar6->socketp
                                             );
                  bVar8 = multi->field_0x1b1 & 0xfb;
                  multi->field_0x1b1 = bVar8;
                  if (iVar5 == -1) goto LAB_005a60ae;
                }
                sh_delentry(pCVar6,sh,iVar4);
              }
              else {
                Curl_hash_delete(&pCVar6->transfers,&data_local,8);
              }
            }
            break;
          }
          pcVar1 = cur_poll.sockets + uVar9;
          uVar9 = uVar9 + 1;
        } while (iVar4 != *pcVar1);
        uVar12 = uVar12 + 1;
      } while( true );
    }
    bVar8 = cur_poll.actions[uVar12];
    iVar4 = cur_poll.sockets[uVar12];
    pCVar6 = sh_getentry(sh,iVar4);
    if (pCVar6 == (Curl_sh_entry *)0x0) {
      local_54 = iVar4;
      pCVar6 = sh_getentry(sh,iVar4);
      if (pCVar6 == (Curl_sh_entry *)0x0) {
        pCVar6 = (Curl_sh_entry *)(*Curl_ccalloc)(1,0x48);
        if (pCVar6 == (Curl_sh_entry *)0x0) {
          return CURLM_OUT_OF_MEMORY;
        }
        Curl_hash_init((Curl_hash *)pCVar6,0xd,trhash,trhash_compare,trhash_dtor);
        pvVar7 = Curl_hash_add(sh,&local_54,4,pCVar6);
        if (pvVar7 == (void *)0x0) {
          Curl_hash_destroy((Curl_hash *)pCVar6);
          (*Curl_cfree)(pCVar6);
          return CURLM_OUT_OF_MEMORY;
        }
      }
LAB_005a5f00:
      pCVar6->users = pCVar6->users + 1;
      if ((bVar8 & 1) != 0) {
        pCVar6->readers = pCVar6->readers + 1;
      }
      if ((bVar8 & 2) != 0) {
        pCVar6->writers = pCVar6->writers + 1;
      }
      pvVar7 = Curl_hash_add(&pCVar6->transfers,&data_local,8,data_local);
      bVar3 = true;
      if (pvVar7 == (void *)0x0) {
        Curl_hash_destroy(&pCVar6->transfers);
        return CURLM_OUT_OF_MEMORY;
      }
    }
    else {
      uVar9 = 0;
      do {
        uVar10 = uVar9;
        if ((data_local->last_poll).num == uVar10) goto LAB_005a5f00;
        uVar9 = uVar10 + 1;
      } while (iVar4 != (data_local->last_poll).sockets[uVar10]);
      bVar2 = (data_local->last_poll).actions[uVar10];
      if (bVar2 == 0) goto LAB_005a5f00;
      if (bVar2 != bVar8) {
        if ((bVar2 & 1) != 0) {
          pCVar6->readers = pCVar6->readers - 1;
        }
        if ((bVar2 & 2) != 0) {
          pCVar6->writers = pCVar6->writers - 1;
        }
        if ((bVar8 & 1) != 0) {
          pCVar6->readers = pCVar6->readers + 1;
        }
        if ((bVar8 & 2) != 0) {
          pCVar6->writers = pCVar6->writers + 1;
        }
      }
      bVar3 = false;
    }
    uVar11 = (uint)(pCVar6->readers != 0) + (uint)(pCVar6->writers != 0) * 2;
    if ((bVar3) || (pCVar6->action != uVar11)) {
      if (multi->socket_cb != (curl_socket_callback)0x0) {
        multi->field_0x1b1 = multi->field_0x1b1 | 4;
        iVar4 = (*multi->socket_cb)(data_local,iVar4,uVar11,multi->socket_userp,pCVar6->socketp);
        bVar8 = multi->field_0x1b1 & 0xfb;
        multi->field_0x1b1 = bVar8;
        if (iVar4 == -1) {
LAB_005a60ae:
          multi->field_0x1b1 = bVar8 | 0x10;
          return CURLM_ABORTED_BY_CALLBACK;
        }
      }
      pCVar6->action = uVar11;
    }
    uVar12 = uVar12 + 1;
  } while( true );
}

Assistant:

static CURLMcode singlesocket(struct Curl_multi *multi,
                              struct Curl_easy *data)
{
  struct easy_pollset cur_poll;
  unsigned int i;
  struct Curl_sh_entry *entry;
  curl_socket_t s;
  int rc;

  /* Fill in the 'current' struct with the state as it is now: what sockets to
     supervise and for what actions */
  multi_getsock(data, &cur_poll);

  /* We have 0 .. N sockets already and we get to know about the 0 .. M
     sockets we should have from now on. Detect the differences, remove no
     longer supervised ones and add new ones */

  /* walk over the sockets we got right now */
  for(i = 0; i < cur_poll.num; i++) {
    unsigned char cur_action = cur_poll.actions[i];
    unsigned char last_action = 0;
    int comboaction;

    s = cur_poll.sockets[i];

    /* get it from the hash */
    entry = sh_getentry(&multi->sockhash, s);
    if(entry) {
      /* check if new for this transfer */
      unsigned int j;
      for(j = 0; j< data->last_poll.num; j++) {
        if(s == data->last_poll.sockets[j]) {
          last_action = data->last_poll.actions[j];
          break;
        }
      }
    }
    else {
      /* this is a socket we didn't have before, add it to the hash! */
      entry = sh_addentry(&multi->sockhash, s);
      if(!entry)
        /* fatal */
        return CURLM_OUT_OF_MEMORY;
    }
    if(last_action && (last_action != cur_action)) {
      /* Socket was used already, but different action now */
      if(last_action & CURL_POLL_IN)
        entry->readers--;
      if(last_action & CURL_POLL_OUT)
        entry->writers--;
      if(cur_action & CURL_POLL_IN)
        entry->readers++;
      if(cur_action & CURL_POLL_OUT)
        entry->writers++;
    }
    else if(!last_action) {
      /* a new transfer using this socket */
      entry->users++;
      if(cur_action & CURL_POLL_IN)
        entry->readers++;
      if(cur_action & CURL_POLL_OUT)
        entry->writers++;

      /* add 'data' to the transfer hash on this socket! */
      if(!Curl_hash_add(&entry->transfers, (char *)&data, /* hash key */
                        sizeof(struct Curl_easy *), data)) {
        Curl_hash_destroy(&entry->transfers);
        return CURLM_OUT_OF_MEMORY;
      }
    }

    comboaction = (entry->writers ? CURL_POLL_OUT : 0) |
                   (entry->readers ? CURL_POLL_IN : 0);

    /* socket existed before and has the same action set as before */
    if(last_action && ((int)entry->action == comboaction))
      /* same, continue */
      continue;

    if(multi->socket_cb) {
      set_in_callback(multi, TRUE);
      rc = multi->socket_cb(data, s, comboaction, multi->socket_userp,
                            entry->socketp);

      set_in_callback(multi, FALSE);
      if(rc == -1) {
        multi->dead = TRUE;
        return CURLM_ABORTED_BY_CALLBACK;
      }
    }

    entry->action = comboaction; /* store the current action state */
  }

  /* Check for last_poll.sockets that no longer appear in cur_poll.sockets.
   * Need to remove the easy handle from the multi->sockhash->transfers and
   * remove multi->sockhash entry when this was the last transfer */
  for(i = 0; i< data->last_poll.num; i++) {
    unsigned int j;
    bool stillused = FALSE;
    s = data->last_poll.sockets[i];
    for(j = 0; j < cur_poll.num; j++) {
      if(s == cur_poll.sockets[j]) {
        /* this is still supervised */
        stillused = TRUE;
        break;
      }
    }
    if(stillused)
      continue;

    entry = sh_getentry(&multi->sockhash, s);
    /* if this is NULL here, the socket has been closed and notified so
       already by Curl_multi_closed() */
    if(entry) {
      unsigned char oldactions = data->last_poll.actions[i];
      /* this socket has been removed. Decrease user count */
      entry->users--;
      if(oldactions & CURL_POLL_OUT)
        entry->writers--;
      if(oldactions & CURL_POLL_IN)
        entry->readers--;
      if(!entry->users) {
        if(multi->socket_cb) {
          set_in_callback(multi, TRUE);
          rc = multi->socket_cb(data, s, CURL_POLL_REMOVE,
                                multi->socket_userp, entry->socketp);
          set_in_callback(multi, FALSE);
          if(rc == -1) {
            multi->dead = TRUE;
            return CURLM_ABORTED_BY_CALLBACK;
          }
        }
        sh_delentry(entry, &multi->sockhash, s);
      }
      else {
        /* still users, but remove this handle as a user of this socket */
        if(Curl_hash_delete(&entry->transfers, (char *)&data,
                            sizeof(struct Curl_easy *))) {
          DEBUGASSERT(NULL);
        }
      }
    }
  } /* for loop over num */

  /* Remember for next time */
  memcpy(&data->last_poll, &cur_poll, sizeof(data->last_poll));
  return CURLM_OK;
}